

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

void __thiscall tcmalloc::PageHeap::RemoveFromFreeList(PageHeap *this,Span *span)

{
  bool bVar1;
  Span *local_18;
  Span *span_local;
  PageHeap *this_local;
  
  local_18 = span;
  span_local = (Span *)this;
  if (span->location == 0) {
    __assert_fail("span->location != Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x185,"void tcmalloc::PageHeap::RemoveFromFreeList(Span *)");
  }
  if (span->npages < 0x80) {
    if (span->location == 1) {
      this->small_normal_size_[span->npages] = this->small_normal_size_[span->npages] - 1;
      (this->stat).small_normal_bytes = (this->stat).small_normal_bytes + span->npages * -0x2000;
      ListRemove(span);
    }
    else {
      this->small_returned_size_[span->npages] = this->small_returned_size_[span->npages] - 1;
      (this->stat).small_returned_bytes = (this->stat).small_returned_bytes + span->npages * -0x2000
      ;
      ListRemove(span);
    }
  }
  else if (span->location == 1) {
    (this->stat).large_normal_bytes = (this->stat).large_normal_bytes + span->npages * -0x2000;
    std::
    set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
    ::erase(&this->large_normal_,&local_18);
  }
  else {
    (this->stat).large_returned_bytes = (this->stat).large_returned_bytes + span->npages * -0x2000;
    std::
    set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
    ::erase(&this->large_returned_,&local_18);
  }
  if (local_18->location == 1) {
    (this->stat).normal_bytes = (this->stat).normal_bytes + local_18->npages * -0x2000;
  }
  else {
    (this->stat).returned_bytes = (this->stat).returned_bytes + local_18->npages * -0x2000;
  }
  bVar1 = CheckSmallList(this);
  if (bVar1) {
    return;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0x1a0,"void tcmalloc::PageHeap::RemoveFromFreeList(Span *)");
}

Assistant:

void RemoveFromFreeList(Span* span) {
        assert(span->location != Span::IN_USE);
        if (span->npages <= spanSmallPages) {
            if (span->location == Span::IN_NORMAL) {
                small_normal_size_[span->npages]--;
                stat.small_normal_bytes -= span->npages * spanPageSize;
                ListRemove(span);
            } else {
                small_returned_size_[span->npages]--;
                stat.small_returned_bytes -= span->npages * spanPageSize;
                ListRemove(span);
            }
        } else {
            if (span->location == Span::IN_NORMAL) {
                stat.large_normal_bytes -= span->npages * spanPageSize;
                large_normal_.erase(span);
            } else {
                stat.large_returned_bytes -= span->npages * spanPageSize;
                large_returned_.erase(span);
            }
        }

        if (span->location == Span::IN_NORMAL) {
            stat.normal_bytes -= span->npages * spanPageSize;
        } else {
            stat.returned_bytes -= span->npages * spanPageSize;
        }

        assert(CheckSmallList());
    }